

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O2

void __thiscall adios2::core::engine::DataManWriter::~DataManWriter(DataManWriter *this)

{
  int in_ESI;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__DataManWriter_00825400;
  if ((this->super_Engine).m_IsClosed == false) {
    DoClose(this,in_ESI);
  }
  std::
  deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
  ::~deque(&(this->m_BufferQueue).c);
  std::thread::~thread(&this->m_PublishThread);
  std::thread::~thread(&this->m_ReplyThread);
  DataManMonitor::~DataManMonitor(&this->m_Monitor);
  zmq::ZmqReqRep::~ZmqReqRep(&this->m_Replier);
  zmq::ZmqPubSub::~ZmqPubSub(&this->m_Publisher);
  adios2::format::DataManSerializer::~DataManSerializer(&this->m_Serializer);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&this->m_HandshakeJson);
  std::__cxx11::string::~string((string *)&this->m_FloatAccuracy);
  std::__cxx11::string::~string((string *)&this->m_TransportMode);
  std::__cxx11::string::~string((string *)&this->m_IPAddress);
  Engine::~Engine(&this->super_Engine);
  return;
}

Assistant:

DataManWriter::~DataManWriter()
{
    if (not m_IsClosed)
    {
        DoClose();
    }
}